

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O3

void __thiscall
testing::TestPartResult::TestPartResult
          (TestPartResult *this,Type a_type,char *a_file_name,int a_line_number,char *a_message)

{
  size_t sVar1;
  char *message;
  char *__s;
  allocator local_31;
  
  this->type_ = a_type;
  __s = anon_var_dwarf_66ec33 + 9;
  if (a_file_name != (char *)0x0) {
    __s = a_file_name;
  }
  (this->file_name_)._M_dataplus._M_p = (pointer)&(this->file_name_).field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->file_name_,__s,__s + sVar1);
  this->line_number_ = a_line_number;
  ExtractSummary_abi_cxx11_(&this->summary_,(TestPartResult *)a_message,message);
  std::__cxx11::string::string((string *)&this->message_,a_message,&local_31);
  return;
}

Assistant:

TestPartResult(Type a_type, const char* a_file_name, int a_line_number,
                 const char* a_message)
      : type_(a_type),
        file_name_(a_file_name == nullptr ? "" : a_file_name),
        line_number_(a_line_number),
        summary_(ExtractSummary(a_message)),
        message_(a_message) {}